

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O2

void ucnv_extGetUnicodeSet_63
               (UConverterSharedData *sharedData,USetAdder *sa,UConverterUnicodeSet which,
               UConverterSetFilter filter,UErrorCode *pErrorCode)

{
  ushort uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  uint uVar5;
  uint value;
  UConverterSharedData *pUVar6;
  UBool UVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  UConverterUnicodeSet which_00;
  uint minLength;
  ushort *puVar13;
  UChar *s_00;
  int32_t in_stack_ffffffffffffff58;
  UConverterSharedData *sharedData_00;
  UChar s [19];
  
  pUVar6 = (UConverterSharedData *)(sharedData->mbcs).extIndexes;
  if (pUVar6 != (UConverterSharedData *)0x0) {
    uVar2 = pUVar6->toUnicodeStatus;
    uVar3 = (pUVar6->mbcs).countToUFallbacks;
    iVar4 = *(int *)((long)&(pUVar6->mbcs).stateTable + 4);
    uVar5 = *(uint *)&pUVar6->field_0x2c;
    if (filter == UCNV_SET_FILTER_2022_CN) {
      which_00 = UCNV_SET_COUNT|UCNV_ROUNDTRIP_AND_FALLBACK_SET;
    }
    else {
      which_00 = (filter != UCNV_SET_FILTER_NONE || (sharedData->mbcs).outputType == 0xdb) +
                 UCNV_ROUNDTRIP_AND_FALLBACK_SET;
    }
    uVar11 = 0;
    if (0 < (int)uVar5) {
      uVar11 = (ulong)uVar5;
    }
    minLength = 0;
    sharedData_00 = pUVar6;
    for (uVar10 = 0; uVar10 != uVar11; uVar10 = uVar10 + 1) {
      uVar1 = *(ushort *)((long)(pUVar6->mbcs).sbcsIndex + uVar10 * 2 + (long)(int)uVar2 + -0x68);
      if ((int)uVar5 < (int)(uint)uVar1) {
        for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 1) {
          uVar9 = (ulong)*(ushort *)
                          ((long)(pUVar6->mbcs).sbcsIndex +
                          lVar12 * 2 + (ulong)uVar1 * 2 + (long)(int)uVar2 + -0x68);
          if (uVar9 == 0) {
            minLength = minLength + 0x10;
          }
          else {
            puVar13 = (ushort *)
                      ((long)(pUVar6->mbcs).sbcsIndex + uVar9 * 8 + (long)(int)uVar3 + -0x68);
            do {
              value = *(uint *)((long)(pUVar6->mbcs).sbcsIndex +
                               (ulong)*puVar13 * 4 + (long)iVar4 + -0x68);
              if (value != 0) {
                if (value < 0x1000000) {
                  if (minLength < 0x10000) {
                    s_00 = (UChar *)0x1;
                    uVar8 = minLength;
                  }
                  else {
                    uVar8 = (minLength >> 10) - 0x2840;
                    s[1] = (ushort)minLength & 0x3ff | 0xdc00;
                    s_00 = (UChar *)0x2;
                  }
                  s[0] = (UChar)uVar8;
                  ucnv_extGetUnicodeSetString
                            (sharedData_00,(int32_t *)sa,(USetAdder *)(ulong)which,which_00,
                             minLength,(UChar32)s,s_00,value,in_stack_ffffffffffffff58,
                             (UErrorCode *)sharedData_00);
                }
                else {
                  UVar7 = extSetUseMapping(which,which_00,value);
                  if (UVar7 != '\0') {
                    switch(filter) {
                    case UCNV_SET_FILTER_2022_CN:
                      if ((value & 0x1f000000) == 0x3000000 && (value & 0xff0000) < 0x830000)
                      goto switchD_002f5abb_default;
                      break;
                    case UCNV_SET_FILTER_SJIS:
                      if (((value & 0x1f000000) == 0x2000000) &&
                         ((value & 0xffffff) - 0x8140 < 0x6ebd)) goto switchD_002f5abb_default;
                      break;
                    case UCNV_SET_FILTER_GR94DBCS:
                      if (((value & 0x1f000000) == 0x2000000) &&
                         ((value + 0x5e5f & 0xfffe) < 0x5d5e)) {
joined_r0x002f5baf:
                        if ((value + 0x5f & 0xfe) < 0x5e) goto switchD_002f5abb_default;
                      }
                      break;
                    case UCNV_SET_FILTER_HZ:
                      if (((value & 0x1f000000) == 0x2000000) &&
                         ((value + 0x5e5f & 0xfffe) < 0x5c5e)) goto joined_r0x002f5baf;
                      break;
                    default:
switchD_002f5abb_default:
                      (*(code *)sa->add)(sa->set,minLength);
                    }
                  }
                }
              }
              puVar13 = puVar13 + 1;
              minLength = minLength + 1;
            } while ((minLength & 0xf) != 0);
          }
        }
      }
      else {
        minLength = minLength + 0x400;
      }
    }
  }
  return;
}

Assistant:

U_CFUNC void
ucnv_extGetUnicodeSet(const UConverterSharedData *sharedData,
                      const USetAdder *sa,
                      UConverterUnicodeSet which,
                      UConverterSetFilter filter,
                      UErrorCode *pErrorCode) {
    const int32_t *cx;
    const uint16_t *stage12, *stage3, *ps2, *ps3;
    const uint32_t *stage3b;

    uint32_t value;
    int32_t st1, stage1Length, st2, st3, minLength;

    UChar s[UCNV_EXT_MAX_UCHARS];
    UChar32 c;
    int32_t length;

    cx=sharedData->mbcs.extIndexes;
    if(cx==NULL) {
        return;
    }

    stage12=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_STAGE_12_INDEX, uint16_t);
    stage3=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_STAGE_3_INDEX, uint16_t);
    stage3b=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_STAGE_3B_INDEX, uint32_t);

    stage1Length=cx[UCNV_EXT_FROM_U_STAGE_1_LENGTH];

    /* enumerate the from-Unicode trie table */
    c=0; /* keep track of the current code point while enumerating */

    if(filter==UCNV_SET_FILTER_2022_CN) {
        minLength=3;
    } else if( sharedData->mbcs.outputType==MBCS_OUTPUT_DBCS_ONLY ||
               filter!=UCNV_SET_FILTER_NONE
    ) {
        /* DBCS-only, ignore single-byte results */
        minLength=2;
    } else {
        minLength=1;
    }

    /*
     * the trie enumeration is almost the same as
     * in MBCSGetUnicodeSet() for MBCS_OUTPUT_1
     */
    for(st1=0; st1<stage1Length; ++st1) {
        st2=stage12[st1];
        if(st2>stage1Length) {
            ps2=stage12+st2;
            for(st2=0; st2<64; ++st2) {
                if((st3=(int32_t)ps2[st2]<<UCNV_EXT_STAGE_2_LEFT_SHIFT)!=0) {
                    /* read the stage 3 block */
                    ps3=stage3+st3;

                    do {
                        value=stage3b[*ps3++];
                        if(value==0) {
                            /* no mapping, do nothing */
                        } else if(UCNV_EXT_FROM_U_IS_PARTIAL(value)) {
                            // Recurse for partial results.
                            length=0;
                            U16_APPEND_UNSAFE(s, length, c);
                            ucnv_extGetUnicodeSetString(
                                sharedData, cx, sa, which, minLength,
                                c, s, length,
                                (int32_t)UCNV_EXT_FROM_U_GET_PARTIAL_INDEX(value),
                                pErrorCode);
                        } else if(extSetUseMapping(which, minLength, value)) {
                            switch(filter) {
                            case UCNV_SET_FILTER_2022_CN:
                                if(!(UCNV_EXT_FROM_U_GET_LENGTH(value)==3 && UCNV_EXT_FROM_U_GET_DATA(value)<=0x82ffff)) {
                                    continue;
                                }
                                break;
                            case UCNV_SET_FILTER_SJIS:
                                if(!(UCNV_EXT_FROM_U_GET_LENGTH(value)==2 && (value=UCNV_EXT_FROM_U_GET_DATA(value))>=0x8140 && value<=0xeffc)) {
                                    continue;
                                }
                                break;
                            case UCNV_SET_FILTER_GR94DBCS:
                                if(!(UCNV_EXT_FROM_U_GET_LENGTH(value)==2 &&
                                     (uint16_t)((value=UCNV_EXT_FROM_U_GET_DATA(value))-0xa1a1)<=(0xfefe - 0xa1a1) &&
                                     (uint8_t)(value-0xa1)<=(0xfe - 0xa1))) {
                                    continue;
                                }
                                break;
                            case UCNV_SET_FILTER_HZ:
                                if(!(UCNV_EXT_FROM_U_GET_LENGTH(value)==2 &&
                                     (uint16_t)((value=UCNV_EXT_FROM_U_GET_DATA(value))-0xa1a1)<=(0xfdfe - 0xa1a1) &&
                                     (uint8_t)(value-0xa1)<=(0xfe - 0xa1))) {
                                    continue;
                                }
                                break;
                            default:
                                /*
                                 * UCNV_SET_FILTER_NONE,
                                 * or UCNV_SET_FILTER_DBCS_ONLY which is handled via minLength
                                 */
                                break;
                            }
                            sa->add(sa->set, c);
                        }
                    } while((++c&0xf)!=0);
                } else {
                    c+=16; /* empty stage 3 block */
                }
            }
        } else {
            c+=1024; /* empty stage 2 block */
        }
    }
}